

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istring.h
# Opt level: O0

bool __thiscall wasm::IString::startsWith<8>(IString *this,char (*str) [8])

{
  bool bVar1;
  string_view local_28;
  char (*local_18) [8];
  char (*str_local) [8];
  IString *this_local;
  
  local_18 = str;
  str_local = (char (*) [8])this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,*str);
  bVar1 = startsWith(this,local_28);
  return bVar1;
}

Assistant:

bool startsWith(const char (&str)[N]) {
    return startsWith(std::string_view(str));
  }